

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O1

void __thiscall
duckdb::DataChunk::Slice
          (DataChunk *this,DataChunk *other,SelectionVector *sel,idx_t count_p,idx_t col_offset)

{
  size_type __n;
  const_reference pvVar1;
  reference pvVar2;
  size_type __n_00;
  SelCache merge_cache;
  _Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this->count = count_p;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if ((other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (other->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar1 = vector<duckdb::Vector,_true>::operator[](&other->data,__n_00);
      __n = col_offset + __n_00;
      if (pvVar1->vector_type == DICTIONARY_VECTOR) {
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&this->data,__n);
        pvVar1 = vector<duckdb::Vector,_true>::operator[](&other->data,__n_00);
        Vector::Reference(pvVar2,pvVar1);
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&this->data,__n);
        Vector::Slice(pvVar2,sel,count_p,(SelCache *)&local_68);
      }
      else {
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&this->data,__n);
        pvVar1 = vector<duckdb::Vector,_true>::operator[](&other->data,__n_00);
        Vector::Reference(pvVar2,pvVar1);
        Vector::Slice(pvVar2,sel,count_p);
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(other->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(other->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  ::std::
  _Hashtable<unsigned_int_*,_std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>,_std::allocator<std::pair<unsigned_int_*const,_duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int_*>,_std::hash<unsigned_int_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void DataChunk::Slice(const DataChunk &other, const SelectionVector &sel, idx_t count_p, idx_t col_offset) {
	D_ASSERT(other.ColumnCount() <= col_offset + ColumnCount());
	this->count = count_p;
	SelCache merge_cache;
	for (idx_t c = 0; c < other.ColumnCount(); c++) {
		if (other.data[c].GetVectorType() == VectorType::DICTIONARY_VECTOR) {
			// already a dictionary! merge the dictionaries
			data[col_offset + c].Reference(other.data[c]);
			data[col_offset + c].Slice(sel, count_p, merge_cache);
		} else {
			data[col_offset + c].Slice(other.data[c], sel, count_p);
		}
	}
}